

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

bool adios2sys::SystemTools::PutEnv(string *env)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  string name;
  char *local_38 [2];
  char local_28 [16];
  
  lVar2 = std::__cxx11::string::find((char)env,0x3d);
  if (lVar2 == -1) {
    kwsysUnPutEnv(env);
    bVar3 = true;
  }
  else {
    std::__cxx11::string::substr((ulong)local_38,(ulong)env);
    iVar1 = setenv(local_38[0],(env->_M_dataplus)._M_p + lVar2 + 1,1);
    bVar3 = iVar1 == 0;
    if (local_38[0] != local_28) {
      operator_delete(local_38[0]);
    }
  }
  return bVar3;
}

Assistant:

bool SystemTools::PutEnv(const std::string& env)
{
  size_t pos = env.find('=');
  if (pos != std::string::npos) {
    std::string name = env.substr(0, pos);
    return setenv(name.c_str(), env.c_str() + pos + 1, 1) == 0;
  } else {
    return kwsysUnPutEnv(env) == 0;
  }
}